

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

void __thiscall miniros::Publication::peerConnect(Publication *this,SubscriberLinkPtr *sub_link)

{
  pointer psVar1;
  element_type *__args_1;
  CallbackQueueInterface *pCVar2;
  pointer psVar3;
  undefined1 local_58 [16];
  _Manager_type local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  std::mutex::lock(&this->callbacks_mutex_);
  psVar1 = (this->callbacks_).
           super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->callbacks_).
                super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    __args_1 = (psVar3->super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
    if (((__args_1->connect_).super__Function_base._M_manager != (_Manager_type)0x0) &&
       (__args_1->callback_queue_ != (CallbackQueueInterface *)0x0)) {
      std::
      make_shared<miniros::PeerConnDisconnCallback,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<miniros::SubscriberLink>const&,bool&,std::weak_ptr<void_const>&>
                ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)local_58,
                 (shared_ptr<miniros::SubscriberLink> *)__args_1,(bool *)sub_link,
                 (weak_ptr<const_void> *)&__args_1->has_tracked_object_);
      local_48 = (_Manager_type)local_58._0_8_;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
      local_58._0_8_ = (void *)0x0;
      local_58._8_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      pCVar2 = ((psVar3->
                super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->callback_queue_;
      (*pCVar2->_vptr_CallbackQueueInterface[2])(pCVar2,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->callbacks_mutex_);
  return;
}

Assistant:

void Publication::peerConnect(const SubscriberLinkPtr& sub_link)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  V_Callback::iterator it = callbacks_.begin();
  V_Callback::iterator end = callbacks_.end();
  for (; it != end; ++it)
  {
    const SubscriberCallbacksPtr& cbs = *it;
    if (cbs->connect_ && cbs->callback_queue_)
    {
      CallbackInterfacePtr cb(std::make_shared<PeerConnDisconnCallback>(cbs->connect_, sub_link, cbs->has_tracked_object_, cbs->tracked_object_));
      cbs->callback_queue_->addCallback(cb, (uint64_t)cbs.get());
    }
  }
}